

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::anon_unknown_0::FileContainsEnums(FileDescriptor *file)

{
  bool bVar1;
  int iVar2;
  Descriptor *message;
  int local_1c;
  int i;
  FileDescriptor *file_local;
  
  iVar2 = FileDescriptor::enum_type_count(file);
  if (iVar2 < 1) {
    for (local_1c = 0; iVar2 = FileDescriptor::message_type_count(file), local_1c < iVar2;
        local_1c = local_1c + 1) {
      message = FileDescriptor::message_type(file,local_1c);
      bVar1 = MessageContainsEnums(message);
      if (bVar1) {
        return true;
      }
    }
    file_local._7_1_ = false;
  }
  else {
    file_local._7_1_ = true;
  }
  return file_local._7_1_;
}

Assistant:

bool FileContainsEnums(const FileDescriptor* file) {
  if (file->enum_type_count() > 0) {
    return true;
  }
  for (int i = 0; i < file->message_type_count(); i++) {
    if (MessageContainsEnums(file->message_type(i))) {
      return true;
    }
  }
  return false;
}